

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O0

void printXOPCC(MCInst *MI,uint Op,SStream *O)

{
  MCOperand *op;
  SStream *ss;
  uint in_ESI;
  MCInst *in_RDI;
  int64_t Imm;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  ss = (SStream *)MCOperand_getImm(op);
  switch(ss) {
  default:
    SStream_concat0(ss,(char *)ss);
    op_addXopCC(in_RDI,1);
    break;
  case (SStream *)0x1:
    SStream_concat0(ss,(char *)ss);
    op_addXopCC(in_RDI,2);
    break;
  case (SStream *)0x2:
    SStream_concat0(ss,(char *)ss);
    op_addXopCC(in_RDI,3);
    break;
  case (SStream *)0x3:
    SStream_concat0(ss,(char *)ss);
    op_addXopCC(in_RDI,4);
    break;
  case (SStream *)0x4:
    SStream_concat0(ss,(char *)ss);
    op_addXopCC(in_RDI,5);
    break;
  case (SStream *)0x5:
    SStream_concat0(ss,(char *)ss);
    op_addXopCC(in_RDI,6);
    break;
  case (SStream *)0x6:
    SStream_concat0(ss,(char *)ss);
    op_addXopCC(in_RDI,7);
    break;
  case (SStream *)0x7:
    SStream_concat0(ss,(char *)ss);
    op_addXopCC(in_RDI,8);
  }
  return;
}

Assistant:

static void printXOPCC(MCInst *MI, unsigned Op, SStream *O)
{
	int64_t Imm = MCOperand_getImm(MCInst_getOperand(MI, Op));

	switch (Imm) {
		default: // llvm_unreachable("Invalid xopcc argument!");
		case 0: SStream_concat0(O, "lt"); op_addXopCC(MI, X86_XOP_CC_LT); break;
		case 1: SStream_concat0(O, "le"); op_addXopCC(MI, X86_XOP_CC_LE); break;
		case 2: SStream_concat0(O, "gt"); op_addXopCC(MI, X86_XOP_CC_GT); break;
		case 3: SStream_concat0(O, "ge"); op_addXopCC(MI, X86_XOP_CC_GE); break;
		case 4: SStream_concat0(O, "eq"); op_addXopCC(MI, X86_XOP_CC_EQ); break;
		case 5: SStream_concat0(O, "neq"); op_addXopCC(MI, X86_XOP_CC_NEQ); break;
		case 6: SStream_concat0(O, "false"); op_addXopCC(MI, X86_XOP_CC_FALSE); break;
		case 7: SStream_concat0(O, "true"); op_addXopCC(MI, X86_XOP_CC_TRUE); break;
	}
}